

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freecell.c
# Opt level: O0

_Bool freecell_isWon(Board *board)

{
  Spot *pSVar1;
  Board *in_RDI;
  Spot *foundation;
  uchar i;
  byte local_11;
  
  local_11 = 0;
  while( true ) {
    if (3 < local_11) {
      return true;
    }
    pSVar1 = board_spotGet(in_RDI,FOUNDATION,local_11);
    if (pSVar1->cardsCount != '\r') break;
    local_11 = local_11 + 1;
  }
  return false;
}

Assistant:

bool freecell_isWon(Board * board)
{
	unsigned char i;
	Spot * foundation;
	for(i=0;i<4;i++)
	{
		foundation = board_spotGet(board, FOUNDATION, i);
		if(foundation->cardsCount!=13)
			return false;
	}

	return true;
}